

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O3

void __thiscall
wasm::
SmallSetBase<wasm::Name,_2UL,_wasm::OrderedFixedStorage<wasm::Name,_2UL>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
::insert(SmallSetBase<wasm::Name,_2UL,_wasm::OrderedFixedStorage<wasm::Name,_2UL>,_std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>_>
         *this,Name *x)

{
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *this_00;
  InsertResult IVar1;
  long lVar2;
  _Alloc_node local_40;
  _Alloc_node __an;
  
  if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::_M_insert_unique<wasm::Name_const&>
              ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)&this->flexible,x);
    return;
  }
  IVar1 = OrderedFixedStorage<wasm::Name,_2UL>::insert(&this->fixed,x);
  if (IVar1 == CouldNotInsert) {
    if ((this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.used != 2) {
      __assert_fail("fixed.used == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xa7,
                    "void wasm::SmallSetBase<wasm::Name, 2, wasm::OrderedFixedStorage<wasm::Name, 2>, std::set<wasm::Name>>::insert(const T &) [T = wasm::Name, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::Name, 2>, FlexibleSet = std::set<wasm::Name>]"
                   );
    }
    __an._M_t = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)x;
    if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("flexible.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xa8,
                    "void wasm::SmallSetBase<wasm::Name, 2, wasm::OrderedFixedStorage<wasm::Name, 2>, std::set<wasm::Name>>::insert(const T &) [T = wasm::Name, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::Name, 2>, FlexibleSet = std::set<wasm::Name>]"
                   );
    }
    this_00 = &this->flexible;
    lVar2 = 8;
    local_40._M_t = &this_00->_M_t;
    do {
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::
      _M_insert_unique_<wasm::Name&,std::_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>::_Alloc_node>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)this_00,(const_iterator)&(this->flexible)._M_t._M_impl.super__Rb_tree_header,
                 (Name *)((long)(this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.storage.
                                _M_elems + lVar2 + -8),&local_40);
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x28);
    std::
    _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
    ::_M_insert_unique<wasm::Name_const&>
              ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                *)this_00,(Name *)__an._M_t);
    if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      __assert_fail("!usingFixed()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,0xac,
                    "void wasm::SmallSetBase<wasm::Name, 2, wasm::OrderedFixedStorage<wasm::Name, 2>, std::set<wasm::Name>>::insert(const T &) [T = wasm::Name, N = 2, FixedStorage = wasm::OrderedFixedStorage<wasm::Name, 2>, FlexibleSet = std::set<wasm::Name>]"
                   );
    }
    (this->fixed).super_FixedStorageBase<wasm::Name,_2UL>.used = 0;
  }
  return;
}

Assistant:

void insert(const T& x) {
    if (usingFixed()) {
      if (fixed.insert(x) == FixedStorage::InsertResult::CouldNotInsert) {
        // We need to add an item but no fixed storage remains to grow. Switch
        // to flexible.
        assert(fixed.used == N);
        assert(flexible.empty());
        flexible.insert(fixed.storage.begin(),
                        fixed.storage.begin() + fixed.used);
        flexible.insert(x);
        assert(!usingFixed());
        fixed.used = 0;
      }
    } else {
      flexible.insert(x);
    }
  }